

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ismine_tests.cpp
# Opt level: O0

ScriptPubKeyMan *
wallet::ismine_tests::CreateDescriptor(CWallet *keystore,string *desc_str,bool success)

{
  long lVar1;
  undefined1 uVar2;
  shared_ptr<Descriptor> *descriptor;
  allocator<char> *__a;
  ScriptPubKeyMan **ppSVar3;
  byte in_DL;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int64_t timestamp;
  int64_t next_index;
  int64_t range_end;
  int64_t range_start;
  value_type *desc;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  parsed_descs;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  WalletDescriptor w_desc;
  string error;
  FlatSigningProvider keys;
  FlatSigningProvider *in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc47;
  assertion_result *in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc58;
  const_string *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  int line;
  const_string *in_stack_fffffffffffffc70;
  char *file;
  unit_test_log_t *in_stack_fffffffffffffc78;
  CWallet *in_stack_fffffffffffffc80;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  FlatSigningProvider *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  undefined1 internal;
  string *in_stack_fffffffffffffd08;
  ScriptPubKeyMan *pSVar4;
  FlatSigningProvider *in_stack_fffffffffffffd10;
  WalletDescriptor *in_stack_fffffffffffffd18;
  CWallet *in_stack_fffffffffffffd20;
  const_string local_2d0;
  assertion_result local_290 [4];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CWallet::SetWalletFlag(in_stack_fffffffffffffc80,(uint64_t)in_stack_fffffffffffffc78);
  uVar2 = (undefined1)((ulong)in_stack_fffffffffffffc80 >> 0x38);
  FlatSigningProvider::FlatSigningProvider(in_stack_fffffffffffffc38);
  std::__cxx11::string::string(in_stack_fffffffffffffc50);
  Parse((string *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
        in_stack_fffffffffffffc90,
        (string *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),(bool)uVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48,
               (pointer)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
               (unsigned_long)in_stack_fffffffffffffc38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68
               ,in_stack_fffffffffffffc60);
    std::
    vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ::empty((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)in_stack_fffffffffffffc48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffc48,(bool)in_stack_fffffffffffffc47);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48,
               (pointer)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
               (unsigned_long)in_stack_fffffffffffffc38);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48,
               (pointer)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
               (unsigned_long)in_stack_fffffffffffffc38);
    in_stack_fffffffffffffc38 = (FlatSigningProvider *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_290,(lazy_ostream *)&stack0xfffffffffffffd50,&local_2d0,0x1e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffc38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc38);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  if ((in_DL & 1) == 0) {
    pSVar4 = (ScriptPubKeyMan *)0x0;
  }
  else {
    descriptor = (shared_ptr<Descriptor> *)
                 std::
                 vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                 ::at((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                       *)in_stack_fffffffffffffc48,
                      CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
    std::shared_ptr<Descriptor>::shared_ptr<Descriptor,std::default_delete<Descriptor>,void>
              ((shared_ptr<Descriptor> *)in_stack_fffffffffffffc38,
               (unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)0xdb8408);
    WalletDescriptor::WalletDescriptor
              ((WalletDescriptor *)CONCAT17(uVar2,in_stack_fffffffffffffc88),descriptor,
               (uint64_t)in_stack_fffffffffffffc78,
               (int32_t)((ulong)in_stack_fffffffffffffc70 >> 0x20),
               (int32_t)in_stack_fffffffffffffc70,
               (int32_t)((ulong)in_stack_fffffffffffffc68 >> 0x20));
    std::shared_ptr<Descriptor>::~shared_ptr((shared_ptr<Descriptor> *)in_stack_fffffffffffffc38);
    __a = (allocator<char> *)
          MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                    ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffc38);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)__a,
               (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffc70,
               in_stack_fffffffffffffc68,(char *)in_stack_fffffffffffffc60,
               (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffc58 >> 0x18,0));
    line = (int)((ulong)in_RDI >> 0x20);
    file = &stack0xfffffffffffffd17;
    std::allocator<char>::allocator();
    internal = (undefined1)((ulong)in_RDI >> 0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_fffffffffffffc88),(char *)descriptor,__a);
    pSVar4 = CWallet::AddWalletDescriptor
                       (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                        in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,(bool)internal);
    ppSVar3 = inline_assertion_check<true,wallet::ScriptPubKeyMan*>
                        ((ScriptPubKeyMan **)__a,file,line,(char *)pSVar4,in_stack_fffffffffffffc58)
    ;
    pSVar4 = *ppSVar3;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc38);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd17);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffc38);
    WalletDescriptor::~WalletDescriptor((WalletDescriptor *)in_stack_fffffffffffffc38);
  }
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)in_stack_fffffffffffffc48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc38);
  FlatSigningProvider::~FlatSigningProvider(in_stack_fffffffffffffc38);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pSVar4;
  }
  __stack_chk_fail();
}

Assistant:

wallet::ScriptPubKeyMan* CreateDescriptor(CWallet& keystore, const std::string& desc_str, const bool success)
{
    keystore.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);

    FlatSigningProvider keys;
    std::string error;
    auto parsed_descs = Parse(desc_str, keys, error, false);
    BOOST_CHECK(success == (!parsed_descs.empty()));
    if (!success) return nullptr;
    auto& desc = parsed_descs.at(0);

    const int64_t range_start = 0, range_end = 1, next_index = 0, timestamp = 1;

    WalletDescriptor w_desc(std::move(desc), timestamp, range_start, range_end, next_index);

    LOCK(keystore.cs_wallet);

    return Assert(keystore.AddWalletDescriptor(w_desc, keys,/*label=*/"", /*internal=*/false));
}